

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O3

void myell_prog_lawful_city(AREA_DATA_conflict *area,CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA local_80;
  
  bVar1 = is_npc(victim);
  if ((!bVar1) || ((victim->act[1] & 4) != 0)) {
    bVar1 = is_npc(ch);
    if (!bVar1) {
      bVar1 = is_affected(ch,(int)gsn_aggressor);
      if (!bVar1) {
        if (ch->law_pass == true) {
          ch->law_pass = false;
        }
        else {
          init_affect(&local_80);
          local_80.where = 0;
          local_80.type = gsn_aggressor;
          local_80.aftype = 5;
          local_80.level = 0x3c;
          local_80.duration = 0xc;
          affect_to_char(ch,&local_80);
        }
      }
    }
  }
  return;
}

Assistant:

void myell_prog_lawful_city(AREA_DATA *area, CHAR_DATA *ch, CHAR_DATA *victim)
{
	AFFECT_DATA af;

	if ((is_npc(victim) && !IS_SET(victim->act, ACT_LAW))
		|| is_npc(ch)
		|| is_affected(ch, gsn_aggressor))
	{
		return;
	}

	if (ch->law_pass)
	{
		ch->law_pass = false;
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_aggressor;
	af.aftype = AFT_INVIS;
	af.level = 60;
	af.duration = 12;
	affect_to_char(ch, &af);
}